

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.c
# Opt level: O0

int conf_parse_stream(FILE *stream,proxy_conf *conf,log_handle *log)

{
  int iVar1;
  size_t sStack_38;
  int ret;
  size_t line_len;
  char *line;
  log_handle *log_local;
  proxy_conf *conf_local;
  FILE *stream_local;
  
  sStack_38 = 0;
  line = (char *)log;
  log_local = (log_handle *)conf;
  conf_local = (proxy_conf *)stream;
  do {
    line_len = 0;
    iVar1 = conf_readline((char **)&line_len,&stack0xffffffffffffffc8,(FILE *)conf_local);
    if (iVar1 < 1) {
      free((void *)line_len);
      return 0;
    }
    iVar1 = conf_parse_line((char *)line_len,(proxy_conf *)log_local,(log_handle *)line);
    free((void *)line_len);
  } while (-1 < iVar1);
  return iVar1;
}

Assistant:

static int conf_parse_stream(FILE *stream, struct proxy_conf *conf,
			     struct log_handle *log)
{
	char *line = NULL;
	size_t line_len = 0;
	int ret = 0;

	while (conf_readline(&line, &line_len, stream) > 0) {
		ret = conf_parse_line(line, conf, log);

		free(line);
		line = NULL;

		if (ret < 0)
			return ret;
	}

	free(line);

	return 0;
}